

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O3

ExprBase * AnalyzeAssignment(ExpressionContext *ctx,SynAssignment *syntax)

{
  int iVar1;
  ExprBase *pEVar2;
  ExprBase *rhs;
  undefined4 extraout_var;
  TypeBase *type;
  
  pEVar2 = AnalyzeExpression(ctx,syntax->lhs);
  rhs = AnalyzeExpression(ctx,syntax->rhs);
  if (((pEVar2->type == (TypeBase *)0x0) || (pEVar2->type->typeID != 0)) &&
     ((rhs->type == (TypeBase *)0x0 || (rhs->type->typeID != 0)))) {
    pEVar2 = CreateAssignment(ctx,&syntax->super_SynBase,pEVar2,rhs);
    return pEVar2;
  }
  iVar1 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
  type = &ExpressionContext::GetErrorType(ctx)->super_TypeBase;
  ExprAssignment::ExprAssignment
            ((ExprAssignment *)CONCAT44(extraout_var,iVar1),&syntax->super_SynBase,type,pEVar2,rhs);
  return &((ExprAssignment *)CONCAT44(extraout_var,iVar1))->super_ExprBase;
}

Assistant:

ExprBase* AnalyzeAssignment(ExpressionContext &ctx, SynAssignment *syntax)
{
	ExprBase *lhs = AnalyzeExpression(ctx, syntax->lhs);
	ExprBase *rhs = AnalyzeExpression(ctx, syntax->rhs);

	if(isType<TypeError>(lhs->type) || isType<TypeError>(rhs->type))
		return new (ctx.get<ExprAssignment>()) ExprAssignment(syntax, ctx.GetErrorType(), lhs, rhs);

	return CreateAssignment(ctx, syntax, lhs, rhs);
}